

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O2

bool __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
remove_sibling(SignalLink *this,size_t id)

{
  SignalLink *this_00;
  
  this_00 = this->next;
  if (this->next == (SignalLink *)0x0) {
    this_00 = this;
  }
  do {
    if (this_00 == this) {
LAB_001a0df0:
      return this_00 != this;
    }
    if (this_00 == (SignalLink *)id) {
      unlink(this_00,(char *)id);
      goto LAB_001a0df0;
    }
    this_00 = this_00->next;
  } while( true );
}

Assistant:

bool remove_sibling(size_t id) {
      for (SignalLink *link = this->next ? this->next : this; link != this;
           link = link->next)
        if (id == size_t(link)) {
          link->unlink();  // deactivate and unlink sibling
          return true;
        }
      return false;
    }